

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TuningsImpl.h
# Opt level: O2

KeyboardMapping * Tunings::readKBMStream(KeyboardMapping *__return_storage_ptr__,istream *inf)

{
  byte bVar1;
  pointer piVar2;
  bool bVar3;
  istream *piVar4;
  ostream *poVar5;
  _Alloc_hider _Var6;
  TuningError *pTVar7;
  int iVar8;
  uint uVar9;
  int __val;
  char *pcVar10;
  int iVar11;
  double dVar12;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  int i;
  ostringstream rawOSS;
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  KeyboardMapping::KeyboardMapping(__return_storage_ptr__);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&rawOSS);
  piVar2 = (__return_storage_ptr__->keys).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((__return_storage_ptr__->keys).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar2) {
    (__return_storage_ptr__->keys).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar2;
  }
  __val = 0;
  uVar9 = 0;
  do {
    do {
      piVar4 = getlineEndingIndependent(inf,&line);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
        if (1 < uVar9 - 7) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&i);
          poVar5 = std::operator<<((ostream *)&i,"Incomplete KBM stream. Only able to read ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,__val);
          std::operator<<(poVar5," lines. Read up to ");
          if (uVar9 < 7) {
            pcVar10 = (char *)((long)&DAT_0010651c + (long)(int)(&DAT_0010651c)[uVar9]);
          }
          else {
            pcVar10 = "unknown state";
          }
          std::operator<<((ostream *)&i,pcVar10);
          pTVar7 = (TuningError *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          TuningError::TuningError(pTVar7,&local_3e0);
          __cxa_throw(pTVar7,&TuningError::typeinfo,TuningError::~TuningError);
        }
        if (__return_storage_ptr__->count !=
            (int)((ulong)((long)(__return_storage_ptr__->keys).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(__return_storage_ptr__->keys).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2)) {
          pTVar7 = (TuningError *)__cxa_allocate_exception(0x28);
          std::__cxx11::to_string(&local_460,__return_storage_ptr__->count);
          std::operator+(&local_440,
                         "Different number of keys than mapping file indicates. Count is ",
                         &local_460);
          std::operator+(&local_420,&local_440," and we parsed ");
          std::__cxx11::to_string
                    (&local_480,
                     (long)(__return_storage_ptr__->keys).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(__return_storage_ptr__->keys).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                         &local_420,&local_480);
          std::operator+(&local_400,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                         " keys.");
          TuningError::TuningError(pTVar7,&local_400);
          __cxa_throw(pTVar7,&TuningError::typeinfo,TuningError::~TuningError);
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)&__return_storage_ptr__->rawText,(string *)&i);
        std::__cxx11::string::~string((string *)&i);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&rawOSS);
        std::__cxx11::string::~string((string *)&line);
        return __return_storage_ptr__;
      }
      poVar5 = std::operator<<((ostream *)&rawOSS,(string *)&line);
      std::operator<<(poVar5,"\n");
      __val = __val + 1;
    } while (*line._M_dataplus._M_p == '!');
    bVar3 = std::operator==(&line,"x");
    if (bVar3) {
      std::__cxx11::string::assign((char *)&line);
    }
    else if (uVar9 != 8) {
      bVar3 = line._M_string_length != 0;
      iVar11 = 0;
      _Var6 = line._M_dataplus;
      do {
        if (!bVar3) {
          pTVar7 = (TuningError *)__cxa_allocate_exception(0x28);
          std::__cxx11::to_string(&local_3a0,__val);
          std::operator+(&local_380,"Invalid line ",&local_3a0);
          std::operator+(&local_360,&local_380,". line=\'");
          std::operator+(&local_480,&local_360,&line);
          std::operator+(&local_460,&local_480,"\'. Bad character is \'");
          std::operator+(&local_440,&local_460,(char)iVar11);
          std::operator+(&local_420,&local_440,"/");
          std::__cxx11::to_string(&local_3c0,(int)(char)iVar11);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                         &local_420,&local_3c0);
          std::operator+(&local_340,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                         "\'");
          TuningError::TuningError(pTVar7,&local_340);
          __cxa_throw(pTVar7,&TuningError::typeinfo,TuningError::~TuningError);
        }
        bVar1 = *_Var6._M_p;
        iVar8 = (int)(char)bVar1;
        bVar3 = true;
        if (iVar8 != 0x20) {
          if (bVar1 == 0) break;
          if ((9 < iVar8 - 0x30U) &&
             ((0x2e < bVar1 || ((0x400000002400U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)))) {
            bVar3 = false;
            iVar11 = iVar8;
          }
        }
        _Var6._M_p = _Var6._M_p + 1;
      } while( true );
    }
    _Var6._M_p = line._M_dataplus._M_p;
    i = atoi(line._M_dataplus._M_p);
    dVar12 = locale_atof(_Var6._M_p);
    switch((ulong)uVar9) {
    case 0:
      __return_storage_ptr__->count = i;
      uVar9 = 0;
      break;
    case 1:
      __return_storage_ptr__->firstMidi = i;
      uVar9 = 1;
      break;
    case 2:
      __return_storage_ptr__->lastMidi = i;
      uVar9 = 2;
      break;
    case 3:
      __return_storage_ptr__->middleNote = i;
      uVar9 = 3;
      break;
    case 4:
      __return_storage_ptr__->tuningConstantNote = i;
      uVar9 = 4;
      break;
    case 5:
      __return_storage_ptr__->tuningFrequency = dVar12;
      __return_storage_ptr__->tuningPitch = dVar12 / 8.17579891564371;
      uVar9 = 5;
      break;
    case 6:
      __return_storage_ptr__->octaveDegrees = i;
      uVar9 = 6;
      break;
    case 7:
      std::vector<int,_std::allocator<int>_>::push_back(&__return_storage_ptr__->keys,&i);
      uVar9 = (__return_storage_ptr__->count ==
              (int)((ulong)((long)(__return_storage_ptr__->keys).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(__return_storage_ptr__->keys).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2)) + 7;
    }
    uVar9 = uVar9 + (uVar9 - 9 < 0xfffffffe);
    if (uVar9 == 7 && __return_storage_ptr__->count == 0) {
      uVar9 = 8;
    }
  } while( true );
}

Assistant:

inline KeyboardMapping readKBMStream(std::istream &inf)
{
    std::string line;

    KeyboardMapping res;
    std::ostringstream rawOSS;
    res.keys.clear();

    enum parsePosition
    {
        map_size = 0,
        first_midi,
        last_midi,
        middle,
        reference,
        freq,
        degree,
        keys,
        trailing
    };
    parsePosition state = map_size;

    int lineno = 0;
    while (getlineEndingIndependent(inf, line))
    {
        rawOSS << line << "\n";
        lineno++;
        if (line[0] == '!')
        {
            continue;
        }

        if (line == "x")
            line = "-1";
        else if (state != trailing)
        {
            const char *lc = line.c_str();
            bool validLine = line.length() > 0;
            char badChar = '\0';
            while (validLine && *lc != '\0')
            {
                if (!(*lc == ' ' || std::isdigit(*lc) || *lc == '.' || *lc == (char)13 ||
                      *lc == '\n'))
                {
                    validLine = false;
                    badChar = *lc;
                }
                lc++;
            }
            if (!validLine)
            {
                throw TuningError("Invalid line " + std::to_string(lineno) + ". line='" + line +
                                  "'. Bad character is '" + badChar + "/" +
                                  std::to_string((int)badChar) + "'");
            }
        }

        int i = std::atoi(line.c_str());
        double v = locale_atof(line.c_str());

        switch (state)
        {
        case map_size:
            res.count = i;
            break;
        case first_midi:
            res.firstMidi = i;
            break;
        case last_midi:
            res.lastMidi = i;
            break;
        case middle:
            res.middleNote = i;
            break;
        case reference:
            res.tuningConstantNote = i;
            break;
        case freq:
            res.tuningFrequency = v;
            res.tuningPitch = res.tuningFrequency / 8.17579891564371;
            break;
        case degree:
            res.octaveDegrees = i;
            break;
        case keys:
            res.keys.push_back(i);
            if ((int)res.keys.size() == res.count)
                state = trailing;
            break;
        case trailing:
            break;
        }
        if (!(state == keys || state == trailing))
            state = (parsePosition)(state + 1);
        if (state == keys && res.count == 0)
            state = trailing;
    }

    if (!(state == keys || state == trailing))
    {
        std::ostringstream oss;
        oss << "Incomplete KBM stream. Only able to read " << lineno << " lines. Read up to ";
        switch (state)
        {
        case map_size:
            oss << "map size.";
            break;
        case first_midi:
            oss << "first midi note.";
            break;
        case last_midi:
            oss << "last midi note.";
            break;
        case middle:
            oss << "scale zero note.";
            break;
        case reference:
            oss << "scale reference note.";
            break;
        case freq:
            oss << "scale reference frequency.";
            break;
        case degree:
            oss << "scale degree.";
            break;
        default:
            oss << "unknown state";
            break;
        }
        throw TuningError(oss.str());
    }

    if ((int)res.keys.size() != res.count)
    {
        throw TuningError("Different number of keys than mapping file indicates. Count is " +
                          std::to_string(res.count) + " and we parsed " +
                          std::to_string(res.keys.size()) + " keys.");
    }

    res.rawText = rawOSS.str();
    return res;
}